

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking_timeout.cpp
# Opt level: O0

bool __thiscall Client::Handshake(Client *this)

{
  bool bVar1;
  ostream *poVar2;
  error_code local_b0 [2];
  error_code local_90;
  lambda local_80 [8];
  lambda_functor<boost::lambda::lambda_functor_base<boost::lambda::other_action<boost::lambda::assignment_action>,_boost::tuples::tuple<boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code_&>_>,_boost::lambda::lambda_functor<boost::lambda::placeholder<1>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>
  local_78 [2];
  host_name_verification local_58;
  undefined1 local_38 [8];
  error_code ec;
  duration<long,std::ratio<1l,1000000000l>> local_20 [8];
  Client *local_18;
  Client *this_local;
  
  local_18 = this;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&ec.cat_,&kMaxHandshakeSeconds);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            (local_20,(duration<long,_std::ratio<1L,_1L>_> *)&ec.cat_);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->deadline_,(duration *)local_20);
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            ((error_code *)local_38,try_again,(type *)0x0);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::set_verify_mode(&this->ssl_socket_,0);
  boost::asio::ssl::host_name_verification::host_name_verification(&local_58,&this->host_);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::set_verify_callback<boost::asio::ssl::host_name_verification>(&this->ssl_socket_,&local_58);
  boost::asio::ssl::host_name_verification::~host_name_verification(&local_58);
  boost::lambda::var<boost::system::error_code>(local_80,(error_code *)local_38);
  boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code&>>::operator=
            (local_78,(lambda_functor<boost::lambda::identity<boost::system::error_code&>> *)
                      local_80,
             (lambda_functor<boost::lambda::placeholder<1>_> *)
             &boost::lambda::(anonymous_namespace)::free1);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  async_handshake<boost::lambda::lambda_functor<boost::lambda::lambda_functor_base<boost::lambda::other_action<boost::lambda::assignment_action>,boost::tuples::tuple<boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code&>>,boost::lambda::lambda_functor<boost::lambda::placeholder<1>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>const>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&this->ssl_socket_,client,local_78);
  do {
    boost::asio::io_context::run_one(&this->io_context_);
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_90,try_again,(type *)0x0);
    bVar1 = boost::system::operator==((error_code *)local_38,&local_90);
  } while (bVar1);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_38);
  if (bVar1) {
    Stop(this);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Handshake failed: ");
    boost::system::error_code::message_abi_cxx11_(local_b0);
    poVar2 = std::operator<<(poVar2,(string *)local_b0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_b0);
    this_local._7_1_ = false;
  }
  else if ((this->stopped_ & 1U) == 0) {
    this_local._7_1_ = true;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Handshake timed out.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Client::Handshake() {
  deadline_.expires_after(std::chrono::seconds(kMaxHandshakeSeconds));

  boost::system::error_code ec = boost::asio::error::would_block;

#if SSL_VERIFY
  ssl_socket_.set_verify_mode(ssl::verify_peer);
#else
  ssl_socket_.set_verify_mode(ssl::verify_none);
#endif  // SSL_VERIFY

  // ssl::host_name_verification has been added since Boost 1.73 to replace
  // ssl::rfc2818_verification.
#if BOOST_VERSION < 107300
  ssl_socket_.set_verify_callback(ssl::rfc2818_verification(host_));
#else
  ssl_socket_.set_verify_callback(ssl::host_name_verification(host_));
#endif  // BOOST_VERSION < 107300

  // HandshakeHandler: void (boost::system::error_code)
  ssl_socket_.async_handshake(ssl::stream_base::client,
                              boost::lambda::var(ec) = boost::lambda::_1);

  // Block until the asynchronous operation has completed.
  do {
    io_context_.run_one();
  } while (ec == boost::asio::error::would_block);

  if (ec) {
    Stop();
    std::cerr << "Handshake failed: " << ec.message() << std::endl;
    return false;
  }

  if (stopped_) {
    // |timed_out_| should be true in this case.
    std::cerr << "Handshake timed out." << std::endl;
    return false;
  }

  return true;
}